

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

void mp_sub_integer_into(mp_int *r,mp_int *a,uintmax_t n)

{
  size_t sVar1;
  BignumInt *pBVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  BignumInt BVar8;
  
  sVar1 = r->nw;
  if (sVar1 != 0) {
    pBVar2 = r->w;
    uVar3 = a->nw;
    uVar4 = ~n;
    uVar6 = 1;
    uVar5 = 0;
    do {
      if (uVar5 < uVar3) {
        BVar8 = a->w[uVar5];
      }
      else {
        BVar8 = 0;
      }
      uVar7 = uVar6 + uVar4;
      uVar6 = (ulong)CARRY8(uVar6,uVar4) + (ulong)CARRY8(uVar7,BVar8);
      if (pBVar2 != (BignumInt *)0x0) {
        pBVar2[uVar5] = uVar7 + BVar8;
      }
      uVar5 = uVar5 + 1;
      uVar4 = 0xffffffffffffffff;
    } while (sVar1 != uVar5);
  }
  return;
}

Assistant:

void mp_sub_integer_into(mp_int *r, mp_int *a, uintmax_t n)
{
    mp_add_masked_integer_into(r->w, r->nw, a, n,
                               ~(BignumInt)0, ~(BignumInt)0, 1);
}